

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

SVInt * __thiscall slang::SVInt::operator|=(SVInt *this,SVInt *rhs)

{
  ulong *puVar1;
  bool bVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint uVar6;
  SVInt *pSVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_28;
  uint local_20;
  byte local_1b;
  
  uVar9 = (this->super_SVIntStorage).bitWidth;
  uVar6 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar9 != uVar6) {
    bVar8 = (rhs->super_SVIntStorage).signFlag & (this->super_SVIntStorage).signFlag;
    if (uVar6 <= uVar9) {
      if (bVar8 == 0) {
        zext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      else {
        sext((SVInt *)&local_28,(bitwidth_t)rhs);
      }
      pSVar7 = operator|=(this,(SVInt *)&local_28);
      if ((local_20 < 0x41) && ((local_1b & 1) == 0)) {
        return pSVar7;
      }
      if ((void *)local_28.val == (void *)0x0) {
        return pSVar7;
      }
      operator_delete__(local_28.pVal);
      return pSVar7;
    }
    if (bVar8 == 0) {
      zext((SVInt *)&local_28,(bitwidth_t)this);
    }
    else {
      sext((SVInt *)&local_28,(bitwidth_t)this);
    }
    operator=(this,(SVInt *)&local_28);
    if (((0x40 < local_20) || ((local_1b & 1) != 0)) && ((void *)local_28.val != (void *)0x0)) {
      operator_delete__(local_28.pVal);
    }
  }
  bVar8 = (this->super_SVIntStorage).unknownFlag;
  if (((bool)bVar8 == false) && ((rhs->super_SVIntStorage).unknownFlag == true)) {
    makeUnknown(this);
    bVar8 = (this->super_SVIntStorage).unknownFlag;
  }
  uVar9 = (this->super_SVIntStorage).bitWidth;
  if (uVar9 < 0x41 && (bVar8 & 1) == 0) {
    (this->super_SVIntStorage).field_0.val =
         (this->super_SVIntStorage).field_0.val | (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    uVar9 = uVar9 + 0x3f;
    uVar6 = uVar9 >> 6;
    if ((bVar8 & 1) == 0) {
      if (0x3f < uVar9) {
        uVar10 = 0;
        do {
          puVar1 = (this->super_SVIntStorage).field_0.pVal + uVar10;
          *puVar1 = *puVar1 | (rhs->super_SVIntStorage).field_0.pVal[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
    }
    else {
      bVar2 = (rhs->super_SVIntStorage).unknownFlag;
      if ((rhs->super_SVIntStorage).bitWidth < 0x41 && (bVar2 & 1U) == 0) {
        puVar1 = (ulong *)((this->super_SVIntStorage).field_0.val + 8);
        *puVar1 = *puVar1 & ~(rhs->super_SVIntStorage).field_0.val;
        puVar1 = (this->super_SVIntStorage).field_0.pVal;
        *puVar1 = ((rhs->super_SVIntStorage).field_0.val | *puVar1) & ~puVar1[1];
      }
      else {
        if ((bVar2 & 1U) == 0) {
          if (uVar9 < 0x40) goto LAB_0022a456;
          uVar10 = 0;
          do {
            puVar1 = (ulong *)((long)(this->super_SVIntStorage).field_0.pVal + uVar10 + uVar6 * 8);
            *puVar1 = *puVar1 & ~*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar10);
            uVar10 = uVar10 + 8;
          } while (uVar6 * 8 != uVar10);
        }
        else {
          if (uVar9 < 0x40) goto LAB_0022a456;
          uVar10 = (ulong)(uVar6 * 8);
          uVar11 = 0;
          do {
            puVar3 = (this->super_SVIntStorage).field_0.pVal;
            puVar4 = (rhs->super_SVIntStorage).field_0.pVal;
            uVar5 = *(ulong *)((long)puVar4 + uVar10 + uVar11);
            *(ulong *)((long)puVar3 + uVar10 + uVar11) =
                 ~*(ulong *)((long)puVar3 + uVar11) & uVar5 |
                 (~*(ulong *)((long)puVar4 + uVar11) | uVar5) &
                 *(ulong *)((long)puVar3 + uVar10 + uVar11);
            uVar11 = uVar11 + 8;
          } while (uVar10 != uVar11);
        }
        if (0x3f < uVar9) {
          uVar10 = 0;
          do {
            puVar3 = (this->super_SVIntStorage).field_0.pVal;
            *(ulong *)((long)puVar3 + uVar10) =
                 (*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar10) |
                 *(ulong *)((long)puVar3 + uVar10)) &
                 ~*(ulong *)((long)puVar3 + (uVar6 << 3) + uVar10);
            uVar10 = uVar10 + 8;
          } while (uVar6 << 3 != uVar10);
        }
      }
    }
  }
LAB_0022a456:
  clearUnusedBits(this);
  checkUnknown(this);
  return this;
}

Assistant:

SVInt& SVInt::operator|=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this |= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val |= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord()) {
                pVal[1] &= ~rhs.val;
                pVal[0] = ~pVal[1] & (pVal[0] | rhs.val);
            }
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++) {
                        pVal[i + words] = (pVal[i + words] & (rhs.pVal[i + words] | ~rhs.pVal[i])) |
                                          (~pVal[i] & rhs.pVal[i + words]);
                    }
                }
                else {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] &= ~rhs.pVal[i];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] | rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] |= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    checkUnknown();
    return *this;
}